

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3PendingTermsFlush(Fts3Table *p)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  sqlite3_stmt *pStmt;
  
  iVar1 = 0;
  iVar2 = 0;
  while( true ) {
    if (iVar1 != 0) {
      sqlite3Fts3PendingTermsClear(p);
      return iVar1;
    }
    if (p->nIndex <= iVar2) break;
    iVar1 = fts3SegmentMerge(p,p->iPrevLangid,iVar2,-1);
    iVar2 = iVar2 + 1;
    if (iVar1 == 0x65) {
      iVar1 = 0;
    }
  }
  sqlite3Fts3PendingTermsClear(p);
  if (p->bHasStat == '\0') {
    return 0;
  }
  if (p->nAutoincrmerge != 0xff) {
    return 0;
  }
  if (p->nLeafAdd == 0) {
    return 0;
  }
  pStmt = (sqlite3_stmt *)0x0;
  iVar1 = fts3SqlStmt(p,0x16,&pStmt,(sqlite3_value **)0x0);
  pStmt_00 = pStmt;
  if (iVar1 != 0) {
    return iVar1;
  }
  sqlite3_bind_int64(pStmt,1,2);
  iVar2 = sqlite3_step(pStmt_00);
  iVar1 = 0;
  if (iVar2 != 0x65) {
    if (iVar2 != 100) goto LAB_001c02df;
    iVar2 = sqlite3_column_int(pStmt_00,0);
    iVar1 = 8;
    if (iVar2 != 1) {
      iVar1 = iVar2;
    }
  }
  p->nAutoincrmerge = iVar1;
LAB_001c02df:
  iVar1 = sqlite3_reset(pStmt_00);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PendingTermsFlush(Fts3Table *p){
  int rc = SQLITE_OK;
  int i;
        
  for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
    rc = fts3SegmentMerge(p, p->iPrevLangid, i, FTS3_SEGCURSOR_PENDING);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }
  sqlite3Fts3PendingTermsClear(p);

  /* Determine the auto-incr-merge setting if unknown.  If enabled,
  ** estimate the number of leaf blocks of content to be written
  */
  if( rc==SQLITE_OK && p->bHasStat
   && p->nAutoincrmerge==0xff && p->nLeafAdd>0
  ){
    sqlite3_stmt *pStmt = 0;
    rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        p->nAutoincrmerge = sqlite3_column_int(pStmt, 0);
        if( p->nAutoincrmerge==1 ) p->nAutoincrmerge = 8;
      }else if( rc==SQLITE_DONE ){
        p->nAutoincrmerge = 0;
      }
      rc = sqlite3_reset(pStmt);
    }
  }
  return rc;
}